

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O3

bool __thiscall glslang::TSymbolTableLevel::hasFunctionName(TSymbolTableLevel *this,TString *name)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  size_type __n;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  
  p_Var4 = (this->level)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var6 = &(this->level)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var6->_M_header;
    do {
      uVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)(p_Var4 + 1),name);
      if (-1 < (int)uVar1) {
        p_Var5 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[uVar1 >> 0x1f];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var6) && (p_Var5[1]._M_left != (_Base_ptr)0x0)) {
      p_Var4 = p_Var5[1]._M_parent;
      pvVar3 = memchr(p_Var4,0x28,(size_t)p_Var5[1]._M_left);
      __n = (long)pvVar3 - (long)p_Var4;
      if ((__n != 0xffffffffffffffff && pvVar3 != (void *)0x0) &&
         (iVar2 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)(p_Var5 + 1),0,__n,name), iVar2 == 0)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

void makeInternalVariable(TSymbol& symbol)
    {
        symbol.setUniqueId(++uniqueId);
    }